

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phong.cpp
# Opt level: O2

RGBColor __thiscall pm::Phong::areaLightShade(Phong *this,ShadeRecord *sr)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  char cVar7;
  Vector3 *in_RDX;
  uint uVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float fVar11;
  float extraout_XMM0_Da_00;
  float fVar13;
  float extraout_XMM0_Db;
  undefined4 uVar14;
  float extraout_XMM0_Db_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar17 [12];
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  RGBColor RVar23;
  Vector3 wi;
  RGBColor local_a0;
  int local_94;
  undefined4 uStack_90;
  float local_8c;
  undefined1 local_88 [16];
  ShadeRecord *local_78;
  undefined1 local_70 [8];
  float local_68;
  _func_int **local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  Vector3 local_40;
  undefined8 uVar12;
  undefined1 auVar15 [16];
  
  local_40.z = -in_RDX[6].x;
  local_40.x = in_RDX[5].y;
  local_40.y = in_RDX[5].z;
  local_40._0_8_ = local_40._0_8_ ^ 0x8000000080000000;
  fVar13 = (sr->ray).o.y;
  uVar12 = *(undefined8 *)&(sr->normal).z;
  fVar19 = (float)uVar12;
  fVar9 = (float)((ulong)uVar12 >> 0x20);
  local_88._4_4_ = fVar9;
  local_88._0_4_ = fVar19 * (sr->ray).o.z;
  local_88._8_8_ = 0;
  (**(code **)(**(long **)(*(long *)(in_RDX + 8) + 0x70) + 0x18))(&local_a0);
  auVar16._4_12_ = local_88._4_12_;
  auVar16._0_4_ = local_88._0_4_ * local_a0.b;
  fVar9 = local_a0.r * fVar19 * fVar9;
  fVar13 = local_a0.g * fVar13 * fVar19;
  (this->super_Material)._vptr_Material = (_func_int **)CONCAT44(fVar13,fVar9);
  (this->super_Material).type_ = (Type)auVar16._0_4_;
  lVar1 = *(long *)(*(long *)(in_RDX + 8) + 0x80);
  lVar2 = *(long *)(*(long *)(in_RDX + 8) + 0x78);
  local_78 = sr + 1;
  uVar8 = 0;
  do {
    if ((ulong)(lVar1 - lVar2 >> 3) <= (ulong)uVar8) {
      RVar23.g = fVar13;
      RVar23.r = fVar9;
      RVar23.b = auVar16._0_4_;
      return RVar23;
    }
    plVar3 = *(long **)(*(long *)(*(long *)(in_RDX + 8) + 0x78) + (ulong)uVar8 * 8);
    (**(code **)(*plVar3 + 0x10))(&local_50,plVar3);
    fVar9 = (float)local_50;
    fVar13 = SUB84(local_50,4);
    auVar16 = ZEXT416((uint)local_48);
    fVar19 = in_RDX[4].x * local_48 + in_RDX[3].y * fVar9 + fVar13 * in_RDX[3].z;
    if (0.0 < fVar19) {
      local_88 = ZEXT416((uint)fVar19);
      if (*(char *)((long)plVar3 + 0xc) == '\x01') {
        local_a0.r = in_RDX[1].y;
        local_a0.g = in_RDX[1].z;
        local_a0.b = in_RDX[2].x;
        local_94 = (int)local_50;
        uStack_90 = local_50._4_4_;
        local_8c = local_48;
        cVar7 = (**(code **)(*plVar3 + 0x20))(plVar3,&local_a0);
        auVar16._8_8_ = extraout_XMM1_Qb;
        auVar16._0_8_ = extraout_XMM1_Qa;
        fVar9 = extraout_XMM0_Da;
        fVar13 = extraout_XMM0_Db;
        if (cVar7 != '\0') goto LAB_0011150f;
      }
      fVar13 = *(float *)&sr->tracer;
      fVar21 = SUB84(sr->world,0);
      auVar17._0_4_ = (float)((ulong)sr->world >> 0x20);
      fVar18 = fVar21 * auVar17._0_4_;
      fVar9 = *(float *)((long)&sr->tracer + 4);
      auVar17._4_8_ = 0;
      RVar23 = GlossySpecular::f((GlossySpecular *)&stack0xffffffffffffffa0,local_78,in_RDX,
                                 &local_40);
      auVar15._0_4_ = RVar23.b;
      auVar15._4_12_ = auVar17;
      fVar19 = SUB84(local_60,0);
      uVar6 = (ulong)local_60 >> 0x20;
      fVar10 = fVar21 * fVar9 * 0.31830987 + local_58;
      (**(code **)(*plVar3 + 0x18))(fVar10,auVar15._0_8_,local_70,plVar3);
      fVar9 = local_70._0_4_;
      fVar20 = local_70._4_4_;
      fVar10 = fVar10 * local_68;
      uVar12 = (**(code **)(*plVar3 + 0x28))(plVar3);
      fVar22 = (float)((ulong)uVar12 >> 0x20);
      fVar11 = (float)uVar12;
      fVar19 = (float)local_88._0_4_ * fVar11 * fVar9 * (fVar19 + fVar18 * 0.31830987);
      fVar20 = (float)local_88._0_4_ *
               fVar11 * fVar20 * ((float)uVar6 + fVar13 * fVar21 * 0.31830987);
      fVar21 = (float)local_88._4_4_ * fVar22 * 0.0;
      fVar22 = (float)local_88._4_4_ * fVar22 * 0.0;
      fVar9 = fVar10 * fVar11 * (float)local_88._0_4_;
      uVar12 = (**(code **)(*plVar3 + 0x30))(plVar3);
      uVar14 = (undefined4)((ulong)uVar12 >> 0x20);
      fVar13 = (float)uVar12;
      local_a0.b = fVar9 / fVar13;
      auVar5._4_4_ = fVar20;
      auVar5._0_4_ = fVar19;
      auVar5._8_4_ = fVar21;
      auVar5._12_4_ = fVar22;
      auVar4._4_4_ = fVar13;
      auVar4._0_4_ = fVar13;
      auVar4._8_4_ = uVar14;
      auVar4._12_4_ = uVar14;
      auVar16 = divps(auVar5,auVar4);
      local_a0._0_8_ = auVar16._0_8_;
      RGBColor::operator+=((RGBColor *)this,&local_a0);
      fVar9 = extraout_XMM0_Da_00;
      fVar13 = extraout_XMM0_Db_00;
    }
LAB_0011150f:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

RGBColor Phong::areaLightShade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += (diffuseBrdf_.f(sr, wo, wi) + specularBrdf_.f(sr, wo, wi)) * light.L(sr) * light.G(sr) * nDotWi / light.pdf(sr);
		}
	}

	return L;
}